

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O1

void Fxu_MatrixAddLiteral(Fxu_Matrix *p,Fxu_Cube *pCube,Fxu_Var *pVar)

{
  Fxu_Lit *pLink;
  
  pLink = (Fxu_Lit *)Fxu_MemFetch(p,0x38);
  pLink->iVar = 0;
  pLink->iCube = 0;
  pLink->pCube = (Fxu_Cube *)0x0;
  pLink->pVar = (Fxu_Var *)0x0;
  pLink->pHPrev = (Fxu_Lit *)0x0;
  pLink->pHNext = (Fxu_Lit *)0x0;
  pLink->pVPrev = (Fxu_Lit *)0x0;
  pLink->pVNext = (Fxu_Lit *)0x0;
  Fxu_ListCubeAddLiteral(pCube,pLink);
  Fxu_ListVarAddLiteral(pVar,pLink);
  pLink->pCube = pCube;
  pLink->pVar = pVar;
  pLink->iCube = pCube->iCube;
  pLink->iVar = pVar->iVar;
  p->nEntries = p->nEntries + 1;
  return;
}

Assistant:

void Fxu_MatrixAddLiteral( Fxu_Matrix * p, Fxu_Cube * pCube, Fxu_Var * pVar )
{
    Fxu_Lit * pLit;
    pLit = MEM_ALLOC_FXU( p, Fxu_Lit, 1 );
    memset( pLit, 0, sizeof(Fxu_Lit) );
    // insert the literal into two linked lists
    Fxu_ListCubeAddLiteral( pCube, pLit );
    Fxu_ListVarAddLiteral( pVar, pLit );
    // set the back pointers
    pLit->pCube = pCube;
    pLit->pVar  = pVar;
    pLit->iCube = pCube->iCube;
    pLit->iVar  = pVar->iVar;
    // increment the literal counter
    p->nEntries++;
}